

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_kernel_1.h
# Opt level: O0

bool __thiscall
dlib::
stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>
::move_next(stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>
            *this)

{
  stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>
  *this_local;
  bool local_1;
  
  if ((this->_at_start & 1U) == 0) {
    if (this->current_element == (node *)0x0) {
      local_1 = false;
    }
    else {
      this->current_element = this->current_element->next;
      if (this->current_element == (node *)0x0) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  else {
    this->_at_start = false;
    if (this->stack_size == 0) {
      local_1 = false;
    }
    else {
      this->current_element = this->top;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool stack_kernel_1<T,mem_manager>::
    move_next (
    ) const
    {
        if (!_at_start)
        {
            if (current_element)
            {
                current_element = current_element->next;
                if (current_element)
                    return true;
                else
                    return false;
                }
            else
            {
                return false;
            }
        }
        else
        {
            _at_start = false;
            if (stack_size)
            {
                current_element = top;
                return true;
            }
            else
            {
                return false;
            }
        }
    }